

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslsocket.cpp
# Opt level: O3

void __thiscall QSslSocketPrivate::QSslSocketPrivate(QSslSocketPrivate *this)

{
  TlsCryptograph *pTVar1;
  QDebug QVar2;
  QTlsBackend *pQVar3;
  TlsCryptograph *pTVar4;
  QLoggingCategory *pQVar5;
  QSslSocketPrivate *this_00;
  long in_FS_OFFSET;
  QByteArrayView QVar6;
  QByteArrayView QVar7;
  QArrayData *local_78;
  undefined8 *local_70;
  undefined4 local_60;
  undefined8 local_5c;
  undefined8 uStack_54;
  undefined4 local_4c;
  char *local_48;
  QDebug local_40;
  QArrayData *local_38 [3];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  QAbstractSocketPrivate::QAbstractSocketPrivate
            ((QAbstractSocketPrivate *)this,QObjectPrivateVersion);
  *(undefined ***)&(this->super_QTcpSocketPrivate).super_QAbstractSocketPrivate =
       &PTR__QSslSocketPrivate_002d0de8;
  (this->super_QTcpSocketPrivate).super_QAbstractSocketPrivate.super_QAbstractSocketEngineReceiver.
  _vptr_QAbstractSocketEngineReceiver = (_func_int **)&PTR__QSslSocketPrivate_002d0e88;
  *(undefined8 *)&(this->super_QTcpSocketPrivate).super_QAbstractSocketPrivate.field_0x26f = 0;
  (this->ignoreErrorsList).d.d = (Data *)0x0;
  (this->ignoreErrorsList).d.ptr = (QSslError *)0x0;
  (this->ignoreErrorsList).d.size = 0;
  this->readyReadEmittedPointer = (bool *)0x0;
  QSslConfigurationPrivate::QSslConfigurationPrivate(&this->configuration);
  (this->verificationPeerName).d.size = 0;
  (this->verificationPeerName).d.d = (Data *)0x0;
  (this->verificationPeerName).d.ptr = (char16_t *)0x0;
  this->allowRootCertOnDemandLoading = true;
  this->plainSocket = (QTcpSocket *)0x0;
  this->paused = false;
  this->flushTriggered = false;
  (this->backend)._M_t.
  super___uniq_ptr_impl<QTlsPrivate::TlsCryptograph,_std::default_delete<QTlsPrivate::TlsCryptograph>_>
  ._M_t.
  super__Tuple_impl<0UL,_QTlsPrivate::TlsCryptograph_*,_std::default_delete<QTlsPrivate::TlsCryptograph>_>
  .super__Head_base<0UL,_QTlsPrivate::TlsCryptograph_*,_false>._M_head_impl = (TlsCryptograph *)0x0;
  QSslConfigurationPrivate::deepCopyDefaultConfiguration(&this->configuration);
  if ((this->configuration).allowRootCertOnDemandLoading == false) {
    this->allowRootCertOnDemandLoading = false;
  }
  pQVar3 = tlsBackendInUse();
  if (pQVar3 == (QTlsBackend *)0x0) {
    this_00 = (QSslSocketPrivate *)QtPrivateLogging::lcSsl();
    if (((this_00->super_QTcpSocketPrivate).super_QAbstractSocketPrivate.field_0x11 & 1) != 0) {
      QSslSocketPrivate(this_00);
    }
  }
  else {
    pTVar4 = (TlsCryptograph *)(**(code **)(*(long *)pQVar3 + 200))(pQVar3);
    pTVar1 = (this->backend)._M_t.
             super___uniq_ptr_impl<QTlsPrivate::TlsCryptograph,_std::default_delete<QTlsPrivate::TlsCryptograph>_>
             ._M_t.
             super__Tuple_impl<0UL,_QTlsPrivate::TlsCryptograph_*,_std::default_delete<QTlsPrivate::TlsCryptograph>_>
             .super__Head_base<0UL,_QTlsPrivate::TlsCryptograph_*,_false>._M_head_impl;
    (this->backend)._M_t.
    super___uniq_ptr_impl<QTlsPrivate::TlsCryptograph,_std::default_delete<QTlsPrivate::TlsCryptograph>_>
    ._M_t.
    super__Tuple_impl<0UL,_QTlsPrivate::TlsCryptograph_*,_std::default_delete<QTlsPrivate::TlsCryptograph>_>
    .super__Head_base<0UL,_QTlsPrivate::TlsCryptograph_*,_false>._M_head_impl = pTVar4;
    if (pTVar1 != (TlsCryptograph *)0x0) {
      (**(code **)(*(long *)pTVar1 + 0x20))();
      pTVar4 = (this->backend)._M_t.
               super___uniq_ptr_impl<QTlsPrivate::TlsCryptograph,_std::default_delete<QTlsPrivate::TlsCryptograph>_>
               ._M_t.
               super__Tuple_impl<0UL,_QTlsPrivate::TlsCryptograph_*,_std::default_delete<QTlsPrivate::TlsCryptograph>_>
               .super__Head_base<0UL,_QTlsPrivate::TlsCryptograph_*,_false>._M_head_impl;
    }
    if (pTVar4 == (TlsCryptograph *)0x0) {
      pQVar5 = QtPrivateLogging::lcSsl();
      if (((pQVar5->field_2).bools.enabledWarning._q_value._M_base._M_i & 1U) != 0) {
        local_48 = pQVar5->name;
        local_60 = 2;
        local_5c = 0;
        uStack_54 = 0;
        local_4c = 0;
        QMessageLogger::warning();
        QVar2.stream = local_40.stream;
        QVar6.m_data = (storage_type *)0x11;
        QVar6.m_size = (qsizetype)local_38;
        QString::fromUtf8(QVar6);
        QTextStream::operator<<((QTextStream *)QVar2.stream,(QString *)local_38);
        if (local_38[0] != (QArrayData *)0x0) {
          LOCK();
          (local_38[0]->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_38[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_38[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_38[0],2,0x10);
          }
        }
        if (*(QTextStream *)(local_40.stream + 0x30) == (QTextStream)0x1) {
          QTextStream::operator<<((QTextStream *)local_40.stream,' ');
        }
        (**(code **)(*(long *)pQVar3 + 0x90))(&local_78,pQVar3);
        if (local_70 == (undefined8 *)0x0) {
          local_70 = &QString::_empty;
        }
        QDebug::putString((QChar *)&local_40,(ulong)local_70);
        if (*(QTextStream *)(local_40.stream + 0x30) == (QTextStream)0x1) {
          QTextStream::operator<<((QTextStream *)local_40.stream,' ');
        }
        QVar2.stream = local_40.stream;
        QVar7.m_data = &DAT_00000014;
        QVar7.m_size = (qsizetype)local_38;
        QString::fromUtf8(QVar7);
        QTextStream::operator<<((QTextStream *)QVar2.stream,(QString *)local_38);
        if (local_38[0] != (QArrayData *)0x0) {
          LOCK();
          (local_38[0]->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_38[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_38[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_38[0],2,0x10);
          }
        }
        if (*(QTextStream *)(local_40.stream + 0x30) == (QTextStream)0x1) {
          QTextStream::operator<<((QTextStream *)local_40.stream,' ');
        }
        if (local_78 != (QArrayData *)0x0) {
          LOCK();
          (local_78->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_78->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_78->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_78,2,0x10);
          }
        }
        QDebug::~QDebug(&local_40);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QSslSocketPrivate::QSslSocketPrivate()
    : initialized(false)
    , mode(QSslSocket::UnencryptedMode)
    , autoStartHandshake(false)
    , connectionEncrypted(false)
    , ignoreAllSslErrors(false)
    , readyReadEmittedPointer(nullptr)
    , allowRootCertOnDemandLoading(true)
    , plainSocket(nullptr)
    , paused(false)
    , flushTriggered(false)
{
    QSslConfigurationPrivate::deepCopyDefaultConfiguration(&configuration);
    // If the global configuration doesn't allow root certificates to be loaded
    // on demand then we have to disable it for this socket as well.
    if (!configuration.allowRootCertOnDemandLoading)
        allowRootCertOnDemandLoading = false;

    const auto *tlsBackend = tlsBackendInUse();
    if (!tlsBackend) {
        qCWarning(lcSsl, "No TLS backend is available");
        return;
    }
    backend.reset(tlsBackend->createTlsCryptograph());
    if (!backend.get()) {
        qCWarning(lcSsl) << "The backend named" << tlsBackend->backendName()
                         << "does not support TLS";
    }
}